

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O3

int __thiscall mkvparser::Track::Info::Copy(Info *this,Info *dst)

{
  ulong __n;
  long lVar1;
  unsigned_long_long uVar2;
  longlong lVar3;
  int iVar4;
  uchar *__dest;
  
  if (dst != this) {
    lVar1 = this->number;
    dst->type = this->type;
    dst->number = lVar1;
    uVar2 = this->seekPreRoll;
    dst->codecDelay = this->codecDelay;
    dst->seekPreRoll = uVar2;
    uVar2 = this->defaultDuration;
    dst->uid = this->uid;
    dst->defaultDuration = uVar2;
    dst->lacing = this->lacing;
    lVar3 = (this->settings).size;
    (dst->settings).start = (this->settings).start;
    (dst->settings).size = lVar3;
    iVar4 = CopyStr(this,0x30,dst);
    if (iVar4 != 0) {
      return -1;
    }
    iVar4 = CopyStr(this,0x38,dst);
    if (iVar4 != 0) {
      return -1;
    }
    iVar4 = CopyStr(this,0x40,dst);
    if (iVar4 != 0) {
      return -1;
    }
    iVar4 = CopyStr(this,0x48,dst);
    if (iVar4 != 0) {
      return -1;
    }
    __n = this->codecPrivateSize;
    if (__n != 0) {
      if (this->codecPrivate == (uchar *)0x0) {
        return -1;
      }
      if (dst->codecPrivate != (uchar *)0x0) {
        return -1;
      }
      if (dst->codecPrivateSize != 0) {
        return -1;
      }
      if (0x80000000 < __n) {
        dst->codecPrivate = (uchar *)0x0;
        return -1;
      }
      __dest = (uchar *)operator_new__(__n,(nothrow_t *)&std::nothrow);
      dst->codecPrivate = __dest;
      if (__dest == (uchar *)0x0) {
        return -1;
      }
      memcpy(__dest,this->codecPrivate,__n);
      dst->codecPrivateSize = __n;
    }
  }
  return 0;
}

Assistant:

int Track::Info::Copy(Info& dst) const {
  if (&dst == this)
    return 0;

  dst.type = type;
  dst.number = number;
  dst.defaultDuration = defaultDuration;
  dst.codecDelay = codecDelay;
  dst.seekPreRoll = seekPreRoll;
  dst.uid = uid;
  dst.lacing = lacing;
  dst.settings = settings;

  // We now copy the string member variables from src to dst.
  // This involves memory allocation so in principle the operation
  // can fail (indeed, that's why we have Info::Copy), so we must
  // report this to the caller.  An error return from this function
  // therefore implies that the copy was only partially successful.

  if (int status = CopyStr(&Info::nameAsUTF8, dst))
    return status;

  if (int status = CopyStr(&Info::language, dst))
    return status;

  if (int status = CopyStr(&Info::codecId, dst))
    return status;

  if (int status = CopyStr(&Info::codecNameAsUTF8, dst))
    return status;

  if (codecPrivateSize > 0) {
    if (codecPrivate == NULL)
      return -1;

    if (dst.codecPrivate)
      return -1;

    if (dst.codecPrivateSize != 0)
      return -1;

    dst.codecPrivate = SafeArrayAlloc<unsigned char>(1, codecPrivateSize);

    if (dst.codecPrivate == NULL)
      return -1;

    memcpy(dst.codecPrivate, codecPrivate, codecPrivateSize);
    dst.codecPrivateSize = codecPrivateSize;
  }

  return 0;
}